

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

TryEmplaceResult * __thiscall
QHash<QAbstractAnimation*,int>::tryEmplace_impl<QAbstractAnimation*const&>
          (QHash<QAbstractAnimation_*,_int> *this,QAbstractAnimation **key)

{
  piter it;
  iterator it_00;
  bool bVar1;
  bool bVar2;
  size_t bucket_00;
  Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *pDVar3;
  QAbstractAnimation **in_RDX;
  Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *in_RSI;
  Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *in_RDI;
  long in_FS_OFFSET;
  Node *n;
  size_t bucketIndex;
  bool resized;
  bool shouldInsert;
  size_t hash;
  Bucket bucket;
  QHash<QAbstractAnimation_*,_int> detachGuard;
  Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *in_stack_ffffffffffffff28;
  Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *in_stack_ffffffffffffff30;
  Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *in_stack_ffffffffffffff38;
  QHash<QAbstractAnimation_*,_int> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar4;
  Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *key_00;
  Bucket local_30;
  Bucket local_20;
  QHash<QAbstractAnimation_*,_int> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key_00 = in_RDI;
  if (*(long *)in_RSI == 0) {
    QHash<QAbstractAnimation_*,_int>::detach
              ((QHash<QAbstractAnimation_*,_int> *)in_stack_ffffffffffffff30);
  }
  local_10.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<QAbstractAnimation_*,_int>::QHash(&local_10);
  QHashPrivate::calculateHash<QAbstractAnimation*>
            ((QAbstractAnimation **)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
  local_20.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_20.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation*,int>>::
             findBucketWithHash<QAbstractAnimation*>
                       (in_RSI,(QAbstractAnimation **)key_00,(size_t)in_RDI);
  bVar1 = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::Bucket::isUnused
                    ((Bucket *)0x67fa8b);
  bVar2 = QHash<QAbstractAnimation_*,_int>::isDetached
                    ((QHash<QAbstractAnimation_*,_int> *)in_stack_ffffffffffffff30);
  if ((!bVar2) ||
     ((bVar1 && (bVar2 = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::
                         shouldGrow(*(Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> **)in_RSI
                                   ), bVar2)))) {
    QHash<QAbstractAnimation_*,_int>::operator=
              (in_stack_ffffffffffffff40,
               (QHash<QAbstractAnimation_*,_int> *)in_stack_ffffffffffffff38);
    bVar2 = false;
    if (bVar1) {
      bVar2 = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::shouldGrow
                        (*(Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> **)in_RSI);
    }
    uVar4 = bVar2;
    bucket_00 = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::Bucket::
                toBucketIndex(&local_20,
                              *(Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> **)in_RSI);
    if (bVar2 == false) {
      in_stack_ffffffffffffff38 =
           QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::detached(in_RDI);
      pDVar3 = in_stack_ffffffffffffff38;
    }
    else {
      pDVar3 = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::detached
                         (in_RDI,CONCAT17(uVar4,in_stack_ffffffffffffff50));
    }
    *(Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> **)in_RSI = pDVar3;
    if (bVar2 == false) {
      QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::Bucket::Bucket
                (&local_30,*(Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> **)in_RSI,
                 bucket_00);
    }
    else {
      local_30 = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation*,int>>::
                 findBucketWithHash<QAbstractAnimation*>
                           (in_RSI,(QAbstractAnimation **)key_00,(size_t)in_RDI);
    }
    local_20 = local_30;
  }
  if (bVar1) {
    in_stack_ffffffffffffff30 =
         (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)
         QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::Bucket::insert
                   ((Bucket *)0x67fc1c);
    QHashPrivate::Node<QAbstractAnimation_*,_int>::createInPlace<>
              ((Node<QAbstractAnimation_*,_int> *)in_stack_ffffffffffffff30,in_RDX);
    *(long *)(*(long *)in_RSI + 8) = *(long *)(*(long *)in_RSI + 8) + 1;
  }
  QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::Bucket::toIterator
            ((Bucket *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  it.bucket = (size_t)in_stack_ffffffffffffff38;
  it.d = in_stack_ffffffffffffff30;
  QHash<QAbstractAnimation_*,_int>::iterator::iterator((iterator *)in_stack_ffffffffffffff28,it);
  it_00.i.bucket = (size_t)in_stack_ffffffffffffff38;
  it_00.i.d = in_stack_ffffffffffffff30;
  QHash<QAbstractAnimation_*,_int>::TryEmplaceResult::TryEmplaceResult
            ((TryEmplaceResult *)in_stack_ffffffffffffff28,it_00,false);
  QHash<QAbstractAnimation_*,_int>::~QHash
            ((QHash<QAbstractAnimation_*,_int> *)in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (TryEmplaceResult *)key_00;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }